

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

kvtree * kvtree_set(kvtree *hash,char *key,kvtree *hash_value)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *elem;
  
  if (key == (char *)0x0 || hash == (kvtree *)0x0) {
    return (kvtree *)0x0;
  }
  elem = kvtree_elem_get(hash,key);
  if (elem != (kvtree_elem *)0x0) {
    pkVar1 = (elem->pointers).le_next;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = (elem->pointers).le_prev;
    }
    *(elem->pointers).le_prev = pkVar1;
    if (elem != (kvtree_elem *)0x0) {
      if (elem->hash != (kvtree_struct *)0x0) {
        kvtree_delete(&elem->hash);
      }
      elem->hash = hash_value;
      goto LAB_001038a9;
    }
  }
  elem = (kvtree_elem *)
         kvtree_malloc(0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                       ,0x2d);
  elem->key = (char *)0x0;
  elem->hash = (kvtree_struct *)0x0;
  kvtree_elem_init(elem,key,hash_value);
LAB_001038a9:
  pkVar1 = hash->lh_first;
  (elem->pointers).le_next = pkVar1;
  if (pkVar1 != (kvtree_elem_struct *)0x0) {
    (pkVar1->pointers).le_prev = &(elem->pointers).le_next;
  }
  hash->lh_first = elem;
  (elem->pointers).le_prev = &hash->lh_first;
  return elem->hash;
}

Assistant:

kvtree* kvtree_set(kvtree* hash, const char* key, kvtree* hash_value)
{
  /* check that we have a valid hash to insert into and a valid key
   * name */
  if (hash == NULL || key == NULL) {
    return NULL;
  }

  /* if there is a match in the hash, pull out that element */
  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem == NULL) {
    /* nothing found, so create a new element and set it */
    elem = kvtree_elem_new();
    kvtree_elem_init(elem, key, hash_value);
  } else {
    /* this key already exists, delete its current hash and reset it */
    if (elem->hash != NULL) {
      kvtree_delete(&elem->hash);
    }
    elem->hash = hash_value;
  }

  /* insert the element into the hash */
  LIST_INSERT_HEAD(hash, elem, pointers);

  /* return the pointer to the hash of the element */
  return elem->hash;
}